

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void QueueResult(TResult *result)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uchar *puVar6;
  long in_FS_OFFSET;
  
  puVar6 = RngStream::GetDigest(*(RngStream **)(in_FS_OFFSET + -0xe0));
  uVar1 = *(undefined8 *)(puVar6 + 8);
  uVar2 = *(undefined8 *)(puVar6 + 0x10);
  uVar3 = *(undefined8 *)(puVar6 + 0x18);
  uVar4 = *(undefined8 *)(puVar6 + 0x20);
  uVar5 = *(undefined8 *)(puVar6 + 0x28);
  *(undefined8 *)result->fId = *(undefined8 *)puVar6;
  *(undefined8 *)(result->fId + 8) = uVar1;
  *(undefined8 *)(result->fId + 0x10) = uVar2;
  *(undefined8 *)(result->fId + 0x18) = uVar3;
  *(undefined8 *)(result->fId + 0x20) = uVar4;
  *(undefined8 *)(result->fId + 0x28) = uVar5;
  pthread_mutex_lock((pthread_mutex_t *)&gPipeLock);
  write(gPipe[1],result,0x834);
  pthread_mutex_unlock((pthread_mutex_t *)&gPipeLock);
  return;
}

Assistant:

void QueueResult(TResult * result)
{
    /* Set our ID first, and send to write thread */
    memcpy(result->fId, tRand->GetDigest(), sizeof(TResult::fId));
    pthread_mutex_lock(&gPipeLock);
    /* Note regarding valgrind: valgrind will complain because of a call to write()
     * referencing non-initialized memory. This is to be expected: the TResult is allocated
     * from stack and is only initialized with meaningful data. Furthermore, when going to
     * disk, only relevant bits will be written. So, for performances reasons, we don't zero
     * the stack object, and tolerate valgrind complain.
     */
    UNUSED_RETURN(write(gPipe[1], result, sizeof(TResult)));
    pthread_mutex_unlock(&gPipeLock);
}